

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nagel.c
# Opt level: O3

void valid_option(int argc,char **argv,char *in_path,char *out_path,float *sigma1,float *sigma2,
                 int *histo,int *sf,float *trsh,char *i_fname,char *v_fname,char *c_fname,
                 char *h_fname,int *nbin,float *incr,int *n_frame,float *alpha,float *delta,
                 int *iter,int *binary,int *row,int *col,int *horn,int *vmag,float *maxv)

{
  byte bVar1;
  char cVar2;
  ulong uVar3;
  char *pcVar4;
  size_t sVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  qnode_ptr_t ptVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  FILE *__stream;
  int *piVar14;
  param512_t *papVar15;
  int extraout_EDX;
  float *pfVar16;
  size_t sVar17;
  size_t sVar18;
  qnode_ptr_t extraout_RDX;
  ulong uVar19;
  uint uVar20;
  int iVar21;
  char **unaff_RBP;
  ulong uVar22;
  char *pcVar23;
  qnode_ptr_t q;
  qnode_ptr_t q_00;
  int iVar24;
  undefined4 in_register_0000003c;
  char *pcVar25;
  float *pfVar26;
  float *unaff_R12;
  int iVar27;
  float *unaff_R13;
  ulong uVar28;
  int iVar29;
  char **unaff_R14;
  int iVar30;
  char *unaff_R15;
  long lVar31;
  float fVar32;
  double extraout_XMM0_Qa;
  float fVar33;
  float fVar34;
  string t0;
  string str_delta;
  string str_alpha;
  string str_tg;
  string str_sg;
  string str_trsh;
  int iStack_d94;
  float fStack_d2c;
  float fStack_d28;
  int iStack_d24;
  ulong uStack_d20;
  int *piStack_d18;
  ulong uStack_d10;
  qnode_ptr_t ptStack_d08;
  ulong uStack_d00;
  code *pcStack_cf8;
  double dStack_cf0;
  double dStack_ce8;
  ulong uStack_ce0;
  undefined8 uStack_cd8;
  disp_field512_t *padStack_cd0;
  int iStack_cc4;
  undefined8 uStack_cc0;
  undefined8 uStack_cb8;
  float *pfStack_ca8;
  float *pfStack_ca0;
  long lStack_c98;
  float *pfStack_c90;
  ulong uStack_c88;
  float fStack_c7c;
  qnode_ptr_t ptStack_c78;
  float afStack_c70 [2];
  int aiStack_c68 [298];
  float afStack_7c0 [2];
  int aiStack_7b8 [300];
  ulong uStack_308;
  float *pfStack_300;
  float *pfStack_2f8;
  char **ppcStack_2f0;
  char **ppcStack_2e8;
  undefined8 uStack_2e0;
  char local_2d8 [8];
  float *pfStack_2d0;
  char local_288 [80];
  char *local_238;
  float *local_230;
  float *local_228;
  char *local_220;
  char local_218 [80];
  int local_1c8 [20];
  int local_178 [20];
  int local_128 [20];
  int local_d8 [20];
  int local_88 [22];
  
  pcVar25 = (char *)CONCAT44(in_register_0000003c,argc);
  local_230 = sigma1;
  if (argc == 1) {
LAB_00105168:
    uStack_2e0 = (code *)0x10516d;
    usage();
  }
  local_238 = in_path;
  local_220 = out_path;
  if (argc - 4U < 0x19) {
    *binary = 0;
    *horn = 0;
    *vmag = 0;
    *sf = 0;
    *histo = 0;
    *trsh = 0.0;
    *maxv = 0.0;
    *sigma1 = 3.0;
    local_d8[0] = 0x302e33;
    *sigma2 = 1.5;
    local_128[0] = 0x352e31;
    *iter = 10;
    *alpha = 5.0;
    local_178[0] = 0x302e35;
    *delta = 1.0;
    local_1c8[0] = 0x302e31;
    *n_frame = 0;
    *nbin = 0;
    builtin_strncpy(i_fname,"Undefined",10);
    piVar14 = (int *)0x656e696665646e55;
    uVar6 = 0x65646e55;
    builtin_strncpy(v_fname,"Undefined",10);
    builtin_strncpy(c_fname,"Undefined",10);
    builtin_strncpy(h_fname,"Undefined",10);
    pcVar23 = (char *)sf;
    pcVar25 = i_fname;
    pfVar26 = (float *)horn;
    unaff_R12 = delta;
    unaff_R13 = alpha;
    unaff_R14 = (char **)vmag;
    unaff_R15 = (char *)binary;
    local_228 = sigma2;
    if (4 < (uint)argc) {
      unaff_R13 = (float *)0x4;
      do {
        unaff_R15 = argv[(long)unaff_R13];
        bVar1 = *unaff_R15;
        unaff_R12 = (float *)(ulong)bVar1;
        uVar20 = -(bVar1 - 0x2d);
        unaff_RBP = (char **)(ulong)uVar20;
        iVar9 = (int)unaff_R13;
        uVar6 = uVar20;
        if (bVar1 == 0x2d) {
          uVar6 = *(byte *)((long)unaff_R15 + 1) - 0x41;
          if (uVar6 == 0) {
            uVar6 = (uint)*(byte *)((long)unaff_R15 + 2);
          }
          if (uVar6 != 0) {
            uVar6 = *(byte *)((long)unaff_R15 + 1) - 0x46;
            if (uVar6 == 0) {
              uVar6 = (uint)*(byte *)((long)unaff_R15 + 2);
            }
            uVar6 = -uVar6;
            goto LAB_0010452e;
          }
          if (argc <= (int)(iVar9 + 1U)) goto LAB_00105154;
          unaff_R15 = (char *)(ulong)(iVar9 + 1U);
          uStack_2e0 = (code *)0x1046fc;
          __isoc99_sscanf(argv[(long)unaff_R15],"%f",alpha);
          pcVar23 = argv[(long)unaff_R15];
          pcVar25 = (char *)local_178;
          goto LAB_001048e2;
        }
LAB_0010452e:
        if (uVar6 == 0) {
          if (argc <= (int)(iVar9 + 1U)) {
            uStack_2e0 = (code *)0x105154;
            valid_option_cold_11();
LAB_00105154:
            uStack_2e0 = (code *)0x105159;
            valid_option_cold_12();
LAB_00105159:
            uStack_2e0 = (code *)0x10515e;
            valid_option_cold_9();
LAB_0010515e:
            uStack_2e0 = (code *)0x105163;
            valid_option_cold_8();
            goto LAB_00105163;
          }
          unaff_R15 = (char *)(ulong)(iVar9 + 1U);
          uStack_2e0 = (code *)0x1046ac;
          __isoc99_sscanf(argv[(long)unaff_R15],"%f",trsh);
          pcVar23 = argv[(long)unaff_R15];
          pcVar25 = (char *)local_88;
          uStack_2e0 = (code *)0x1046bd;
          strcpy(pcVar25,pcVar23);
          *sf = 1;
LAB_001048e7:
          iVar7 = 2;
        }
        else {
          uVar6 = uVar20;
          if (bVar1 == 0x2d) {
            uVar6 = *(byte *)((long)unaff_R15 + 1) - 0x43;
            if (uVar6 == 0) {
              uVar6 = (uint)*(byte *)((long)unaff_R15 + 2);
            }
            if (uVar6 != 0) {
              uVar6 = *(byte *)((long)unaff_R15 + 1) - 0x49;
              if (uVar6 == 0) {
                uVar6 = (uint)*(byte *)((long)unaff_R15 + 2);
              }
              uVar6 = -uVar6;
              goto LAB_00104570;
            }
            if ((int)(iVar9 + 3U) < argc) {
              uStack_2e0 = (code *)0x104798;
              strcpy(c_fname,argv[(long)unaff_R13 + 1]);
              uStack_2e0 = (code *)0x1047b3;
              __isoc99_sscanf(argv[(long)unaff_R13 + 2],"%d",nbin);
              pcVar25 = argv[iVar9 + 3U];
              pcVar23 = "%f";
              uStack_2e0 = (code *)0x1047d2;
              __isoc99_sscanf(pcVar25,"%f",incr);
              *histo = 1;
              iVar7 = 4;
              goto LAB_001048ec;
            }
LAB_00105163:
            uStack_2e0 = (code *)0x105168;
            valid_option_cold_10();
            goto LAB_00105168;
          }
LAB_00104570:
          if (uVar6 == 0) {
            if (argc <= (int)(iVar9 + 1U)) goto LAB_00105159;
            pcVar25 = argv[iVar9 + 1U];
            pcVar23 = "%d";
            pfVar16 = (float *)iter;
LAB_00104731:
            uStack_2e0 = (code *)0x104738;
            __isoc99_sscanf(pcVar25,pcVar23,pfVar16);
            goto LAB_001048e7;
          }
          uStack_2e0 = (code *)0x104587;
          iVar7 = strcmp("-SG",unaff_R15);
          if (iVar7 == 0) {
            if (argc <= (int)(iVar9 + 1U)) goto LAB_0010515e;
            unaff_R15 = (char *)(ulong)(iVar9 + 1U);
            uStack_2e0 = (code *)0x104769;
            __isoc99_sscanf(argv[(long)unaff_R15],"%f",local_230);
            pcVar23 = argv[(long)unaff_R15];
            pcVar25 = (char *)local_d8;
LAB_001048e2:
            uStack_2e0 = (code *)0x1048e7;
            strcpy(pcVar25,pcVar23);
            goto LAB_001048e7;
          }
          pcVar25 = "-TG";
          uStack_2e0 = (code *)0x10459e;
          pcVar23 = unaff_R15;
          iVar7 = strcmp("-TG",unaff_R15);
          uVar6 = (uint)piVar14;
          if (iVar7 == 0) {
            if ((int)(iVar9 + 1U) < argc) {
              unaff_R15 = (char *)(ulong)(iVar9 + 1U);
              uStack_2e0 = (code *)0x104816;
              __isoc99_sscanf(argv[(long)unaff_R15],"%f",local_228);
              pcVar23 = argv[(long)unaff_R15];
              pcVar25 = (char *)local_128;
              goto LAB_001048e2;
            }
            goto LAB_00105177;
          }
          uVar8 = uVar20;
          if (bVar1 == 0x2d) {
            uVar8 = *(byte *)((long)unaff_R15 + 1) - 0x4d;
            if (uVar8 == 0) {
              uVar8 = (uint)*(byte *)((long)unaff_R15 + 2);
            }
            if (uVar8 == 0) {
              if ((int)(iVar9 + 1U) < argc) {
                pcVar25 = argv[iVar9 + 1U];
                pcVar23 = "%d";
                pfVar16 = (float *)n_frame;
                goto LAB_00104731;
              }
              goto LAB_0010518b;
            }
            uVar8 = *(byte *)((long)unaff_R15 + 1) - 0x42;
            if (uVar8 == 0) {
              uVar8 = (uint)*(byte *)((long)unaff_R15 + 2);
            }
            uVar8 = -uVar8;
          }
          if (uVar8 != 0) {
            if (bVar1 == 0x2d) {
              uVar20 = *(byte *)((long)unaff_R15 + 1) - 0x48;
              if (uVar20 == 0) {
                uVar20 = (uint)*(byte *)((long)unaff_R15 + 2);
              }
              if (uVar20 == 0) {
                *horn = 1;
                iVar7 = 1;
                goto LAB_001048ec;
              }
              uVar20 = *(byte *)((long)unaff_R15 + 1) - 0x44;
              if (uVar20 == 0) {
                uVar20 = (uint)*(byte *)((long)unaff_R15 + 2);
              }
              uVar20 = -uVar20;
            }
            if (uVar20 == 0) {
              if ((int)(iVar9 + 1U) < argc) {
                unaff_R15 = (char *)(ulong)(iVar9 + 1U);
                uStack_2e0 = (code *)0x1048d6;
                __isoc99_sscanf(argv[(long)unaff_R15],"%f",delta);
                pcVar23 = argv[(long)unaff_R15];
                pcVar25 = (char *)local_1c8;
                goto LAB_001048e2;
              }
              goto LAB_00105190;
            }
            if (bVar1 == 0x2d) {
              uVar20 = *(byte *)((long)unaff_R15 + 1) - 0x56;
              if (uVar20 == 0) {
                uVar20 = (uint)*(byte *)((long)unaff_R15 + 2);
              }
              unaff_RBP = (char **)(ulong)-uVar20;
            }
            if ((int)unaff_RBP == 0) {
              if ((int)(iVar9 + 1U) < argc) {
                *vmag = 1;
                pcVar25 = argv[iVar9 + 1U];
                pcVar23 = "%f";
                piVar14 = vmag;
                pfVar16 = maxv;
                goto LAB_00104731;
              }
              goto LAB_00105186;
            }
            goto LAB_00105181;
          }
          uVar20 = iVar9 + 2;
          unaff_RBP = (char **)(ulong)uVar20;
          if (argc <= (int)uVar20) goto LAB_0010517c;
          unaff_R15 = "%d";
          uStack_2e0 = (code *)0x104851;
          __isoc99_sscanf(argv[(long)unaff_R13 + 1],"%d",col);
          pcVar25 = argv[uVar20];
          pcVar23 = "%d";
          uStack_2e0 = (code *)0x10486c;
          __isoc99_sscanf(pcVar25,"%d",row);
          *binary = 1;
          iVar7 = 3;
        }
LAB_001048ec:
        uVar6 = (uint)piVar14;
        unaff_R13 = (float *)(ulong)(uint)(iVar9 + iVar7);
        unaff_R14 = argv;
      } while (iVar9 + iVar7 < argc);
    }
    pcVar4 = local_238;
    unaff_RBP = argv;
    if (*nbin < 0x65) {
      pcVar25 = argv[1];
      sVar17 = 0xffffffffffffffff;
      do {
        cVar2 = pcVar25[sVar17 + 1];
        local_2d8[sVar17 + 1] = cVar2;
        pcVar23 = local_220;
        sVar17 = sVar17 + 1;
      } while (cVar2 != '\0');
      sVar5 = sVar17;
      do {
        sVar18 = sVar5;
        cVar2 = "/"[sVar18 - (long)(int)sVar17];
        local_2d8[sVar18] = cVar2;
        sVar5 = sVar18 + 1;
      } while (cVar2 != '\0');
      local_2d8[sVar18] = '\0';
      uStack_2e0 = (code *)0x104978;
      memcpy(pcVar4,local_2d8,sVar18 + 1);
      pcVar25 = argv[2];
      sVar17 = 0xffffffffffffffff;
      do {
        cVar2 = pcVar25[sVar17 + 1];
        local_2d8[sVar17 + 1] = cVar2;
        sVar17 = sVar17 + 1;
      } while (cVar2 != '\0');
      sVar5 = sVar17;
      do {
        sVar18 = sVar5;
        cVar2 = "/"[sVar18 - (long)(int)sVar17];
        local_2d8[sVar18] = cVar2;
        sVar5 = sVar18 + 1;
      } while (cVar2 != '\0');
      local_2d8[sVar18] = '\0';
      uStack_2e0 = (code *)0x1049c9;
      memcpy(pcVar23,local_2d8,sVar18 + 1);
      pcVar4 = local_238;
      pcVar25 = argv[3];
      sVar17 = 0xffffffffffffffff;
      do {
        cVar2 = pcVar4[sVar17 + 1];
        local_2d8[sVar17 + 1] = cVar2;
        sVar17 = sVar17 + 1;
      } while (cVar2 != '\0');
      sVar5 = sVar17;
      do {
        sVar18 = sVar5;
        cVar2 = pcVar25[sVar18 - (long)(int)sVar17];
        local_2d8[sVar18] = cVar2;
        sVar5 = sVar18 + 1;
      } while (cVar2 != '\0');
      local_2d8[sVar18] = '\0';
      uStack_2e0 = (code *)0x104a16;
      memcpy(i_fname,local_2d8,sVar18 + 1);
      builtin_strncpy(local_288,"-sg",4);
      sVar17 = 0xffffffffffffffff;
      do {
        lVar11 = sVar17 + 1;
        local_2d8[sVar17 + 1] = local_288[lVar11];
        sVar17 = sVar17 + 1;
      } while (local_288[lVar11] != '\0');
      sVar5 = sVar17;
      do {
        sVar18 = sVar5;
        cVar2 = *(char *)((long)local_d8 + (sVar18 - (long)(int)sVar17));
        local_2d8[sVar18] = cVar2;
        sVar5 = sVar18 + 1;
      } while (cVar2 != '\0');
      local_2d8[sVar18] = '\0';
      uStack_2e0 = (code *)0x104a62;
      memcpy(local_288,local_2d8,sVar18 + 1);
      sVar17 = 0xffffffffffffffff;
      do {
        lVar11 = sVar17 + 1;
        local_2d8[sVar17 + 1] = local_288[lVar11];
        sVar17 = sVar17 + 1;
      } while (local_288[lVar11] != '\0');
      sVar5 = sVar17;
      do {
        sVar18 = sVar5;
        cVar2 = "-tg"[sVar18 - (long)(int)sVar17];
        local_2d8[sVar18] = cVar2;
        sVar5 = sVar18 + 1;
      } while (cVar2 != '\0');
      local_2d8[sVar18] = '\0';
      uStack_2e0 = (code *)0x104aab;
      memcpy(local_288,local_2d8,sVar18 + 1);
      sVar17 = 0xffffffffffffffff;
      do {
        lVar11 = sVar17 + 1;
        local_2d8[sVar17 + 1] = local_288[lVar11];
        sVar17 = sVar17 + 1;
      } while (local_288[lVar11] != '\0');
      sVar5 = sVar17;
      do {
        sVar18 = sVar5;
        cVar2 = *(char *)((long)local_128 + (sVar18 - (long)(int)sVar17));
        local_2d8[sVar18] = cVar2;
        sVar5 = sVar18 + 1;
      } while (cVar2 != '\0');
      local_2d8[sVar18] = '\0';
      uStack_2e0 = (code *)0x104aef;
      memcpy(local_288,local_2d8,sVar18 + 1);
      sVar17 = 0xffffffffffffffff;
      do {
        lVar11 = sVar17 + 1;
        local_2d8[sVar17 + 1] = local_288[lVar11];
        sVar17 = sVar17 + 1;
      } while (local_288[lVar11] != '\0');
      sVar5 = sVar17;
      do {
        sVar18 = sVar5;
        cVar2 = "-m"[sVar18 - (long)(int)sVar17];
        local_2d8[sVar18] = cVar2;
        sVar5 = sVar18 + 1;
      } while (cVar2 != '\0');
      local_2d8[sVar18] = '\0';
      uStack_2e0 = (code *)0x104b38;
      memcpy(local_288,local_2d8,sVar18 + 1);
      uStack_2e0 = (code *)0x104b58;
      sprintf(local_218,"%d",(ulong)(uint)*n_frame);
      sVar17 = 0xffffffffffffffff;
      do {
        lVar11 = sVar17 + 1;
        local_2d8[sVar17 + 1] = local_288[lVar11];
        sVar17 = sVar17 + 1;
      } while (local_288[lVar11] != '\0');
      sVar5 = sVar17;
      do {
        sVar18 = sVar5;
        cVar2 = local_218[sVar18 - (long)(int)sVar17];
        local_2d8[sVar18] = cVar2;
        sVar5 = sVar18 + 1;
      } while (cVar2 != '\0');
      local_2d8[sVar18] = '\0';
      uStack_2e0 = (code *)0x104b9c;
      memcpy(local_288,local_2d8,sVar18 + 1);
      sVar17 = 0xffffffffffffffff;
      do {
        lVar11 = sVar17 + 1;
        local_2d8[sVar17 + 1] = local_288[lVar11];
        sVar17 = sVar17 + 1;
      } while (local_288[lVar11] != '\0');
      sVar5 = sVar17;
      do {
        sVar18 = sVar5;
        cVar2 = "-i"[sVar18 - (long)(int)sVar17];
        local_2d8[sVar18] = cVar2;
        sVar5 = sVar18 + 1;
      } while (cVar2 != '\0');
      local_2d8[sVar18] = '\0';
      uStack_2e0 = (code *)0x104be5;
      memcpy(local_288,local_2d8,sVar18 + 1);
      uStack_2e0 = (code *)0x104c05;
      sprintf(local_218,"%d",(ulong)(uint)*iter);
      sVar17 = 0xffffffffffffffff;
      do {
        lVar11 = sVar17 + 1;
        local_2d8[sVar17 + 1] = local_288[lVar11];
        sVar17 = sVar17 + 1;
      } while (local_288[lVar11] != '\0');
      sVar5 = sVar17;
      do {
        sVar18 = sVar5;
        cVar2 = local_218[sVar18 - (long)(int)sVar17];
        local_2d8[sVar18] = cVar2;
        sVar5 = sVar18 + 1;
      } while (cVar2 != '\0');
      local_2d8[sVar18] = '\0';
      uStack_2e0 = (code *)0x104c49;
      memcpy(local_288,local_2d8,sVar18 + 1);
      sVar17 = 0xffffffffffffffff;
      do {
        lVar11 = sVar17 + 1;
        local_2d8[sVar17 + 1] = local_288[lVar11];
        sVar17 = sVar17 + 1;
      } while (local_288[lVar11] != '\0');
      sVar5 = sVar17;
      do {
        sVar18 = sVar5;
        cVar2 = "-a"[sVar18 - (long)(int)sVar17];
        local_2d8[sVar18] = cVar2;
        sVar5 = sVar18 + 1;
      } while (cVar2 != '\0');
      local_2d8[sVar18] = '\0';
      uStack_2e0 = (code *)0x104c92;
      memcpy(local_288,local_2d8,sVar18 + 1);
      sVar17 = 0xffffffffffffffff;
      do {
        lVar11 = sVar17 + 1;
        local_2d8[sVar17 + 1] = local_288[lVar11];
        sVar17 = sVar17 + 1;
      } while (local_288[lVar11] != '\0');
      sVar5 = sVar17;
      do {
        sVar18 = sVar5;
        cVar2 = *(char *)((long)local_178 + (sVar18 - (long)(int)sVar17));
        local_2d8[sVar18] = cVar2;
        sVar5 = sVar18 + 1;
      } while (cVar2 != '\0');
      local_2d8[sVar18] = '\0';
      uStack_2e0 = (code *)0x104cd6;
      memcpy(local_288,local_2d8,sVar18 + 1);
      if (*horn == 0) {
        sVar17 = 0xffffffffffffffff;
        do {
          lVar11 = sVar17 + 1;
          local_2d8[sVar17 + 1] = local_288[lVar11];
          sVar17 = sVar17 + 1;
        } while (local_288[lVar11] != '\0');
        sVar5 = sVar17;
        do {
          sVar18 = sVar5;
          cVar2 = "-d"[sVar18 - (long)(int)sVar17];
          local_2d8[sVar18] = cVar2;
          sVar5 = sVar18 + 1;
        } while (cVar2 != '\0');
        local_2d8[sVar18] = '\0';
        uStack_2e0 = (code *)0x104d65;
        memcpy(local_288,local_2d8,sVar18 + 1);
        sVar17 = 0xffffffffffffffff;
        do {
          lVar11 = sVar17 + 1;
          local_2d8[sVar17 + 1] = local_288[lVar11];
          sVar17 = sVar17 + 1;
        } while (local_288[lVar11] != '\0');
        iVar9 = (int)sVar17;
        do {
          cVar2 = *(char *)((long)local_1c8 + (sVar17 - (long)iVar9));
          local_2d8[sVar17] = cVar2;
          sVar17 = sVar17 + 1;
        } while (cVar2 != '\0');
      }
      else {
        sVar17 = 0xffffffffffffffff;
        do {
          lVar11 = sVar17 + 1;
          local_2d8[sVar17 + 1] = local_288[lVar11];
          sVar17 = sVar17 + 1;
        } while (local_288[lVar11] != '\0');
        iVar9 = (int)sVar17;
        do {
          cVar2 = "-h"[sVar17 - (long)iVar9];
          local_2d8[sVar17] = cVar2;
          sVar17 = sVar17 + 1;
        } while (cVar2 != '\0');
      }
      local_2d8[sVar17 - 1] = '\0';
      uStack_2e0 = (code *)0x104da9;
      memcpy(local_288,local_2d8,sVar17);
      if (*sf != 0) {
        sVar17 = 0xffffffffffffffff;
        do {
          lVar11 = sVar17 + 1;
          local_2d8[sVar17 + 1] = local_288[lVar11];
          sVar17 = sVar17 + 1;
        } while (local_288[lVar11] != '\0');
        sVar5 = sVar17;
        do {
          sVar18 = sVar5;
          cVar2 = "-f"[sVar18 - (long)(int)sVar17];
          local_2d8[sVar18] = cVar2;
          sVar5 = sVar18 + 1;
        } while (cVar2 != '\0');
        local_2d8[sVar18] = '\0';
        uStack_2e0 = (code *)0x104e03;
        memcpy(local_288,local_2d8,sVar18 + 1);
        sVar17 = 0xffffffffffffffff;
        do {
          lVar11 = sVar17 + 1;
          local_2d8[sVar17 + 1] = local_288[lVar11];
          sVar17 = sVar17 + 1;
        } while (local_288[lVar11] != '\0');
        sVar5 = sVar17;
        do {
          sVar18 = sVar5;
          cVar2 = *(char *)((long)local_88 + (sVar18 - (long)(int)sVar17));
          local_2d8[sVar18] = cVar2;
          sVar5 = sVar18 + 1;
        } while (cVar2 != '\0');
        local_2d8[sVar18] = '\0';
        uStack_2e0 = (code *)0x104e47;
        memcpy(local_288,local_2d8,sVar18 + 1);
      }
      pcVar25 = *argv;
      sVar17 = 0xffffffffffffffff;
      do {
        cVar2 = pcVar23[sVar17 + 1];
        local_2d8[sVar17 + 1] = cVar2;
        sVar17 = sVar17 + 1;
      } while (cVar2 != '\0');
      sVar5 = sVar17;
      do {
        sVar18 = sVar5;
        cVar2 = pcVar25[sVar18 - (long)(int)sVar17];
        local_2d8[sVar18] = cVar2;
        sVar5 = sVar18 + 1;
      } while (cVar2 != '\0');
      local_2d8[sVar18] = '\0';
      uStack_2e0 = (code *)0x104e85;
      memcpy(v_fname,local_2d8,sVar18 + 1);
      sVar17 = 0xffffffffffffffff;
      do {
        cVar2 = v_fname[sVar17 + 1];
        local_2d8[sVar17 + 1] = cVar2;
        sVar17 = sVar17 + 1;
      } while (cVar2 != '\0');
      sVar5 = sVar17;
      do {
        sVar18 = sVar5;
        cVar2 = "."[sVar18 - (long)(int)sVar17];
        local_2d8[sVar18] = cVar2;
        sVar5 = sVar18 + 1;
      } while (cVar2 != '\0');
      local_2d8[sVar18] = '\0';
      uStack_2e0 = (code *)0x104eca;
      memcpy(v_fname,local_2d8,sVar18 + 1);
      pcVar25 = argv[3];
      sVar17 = 0xffffffffffffffff;
      do {
        cVar2 = v_fname[sVar17 + 1];
        local_2d8[sVar17 + 1] = cVar2;
        sVar17 = sVar17 + 1;
      } while (cVar2 != '\0');
      sVar5 = sVar17;
      do {
        sVar18 = sVar5;
        cVar2 = pcVar25[sVar18 - (long)(int)sVar17];
        local_2d8[sVar18] = cVar2;
        sVar5 = sVar18 + 1;
      } while (cVar2 != '\0');
      local_2d8[sVar18] = '\0';
      uStack_2e0 = (code *)0x104f08;
      memcpy(v_fname,local_2d8,sVar18 + 1);
      sVar17 = 0xffffffffffffffff;
      do {
        cVar2 = v_fname[sVar17 + 1];
        local_2d8[sVar17 + 1] = cVar2;
        sVar17 = sVar17 + 1;
      } while (cVar2 != '\0');
      sVar5 = sVar17;
      do {
        sVar18 = sVar5;
        cVar2 = "F"[sVar18 - (long)(int)sVar17];
        local_2d8[sVar18] = cVar2;
        sVar5 = sVar18 + 1;
      } while (cVar2 != '\0');
      local_2d8[sVar18] = '\0';
      uStack_2e0 = (code *)0x104f50;
      memcpy(v_fname,local_2d8,sVar18 + 1);
      sVar17 = 0xffffffffffffffff;
      do {
        cVar2 = v_fname[sVar17 + 1];
        local_2d8[sVar17 + 1] = cVar2;
        sVar17 = sVar17 + 1;
      } while (cVar2 != '\0');
      sVar5 = sVar17;
      do {
        sVar18 = sVar5;
        cVar2 = local_288[sVar18 - (long)(int)sVar17];
        local_2d8[sVar18] = cVar2;
        sVar5 = sVar18 + 1;
      } while (cVar2 != '\0');
      local_2d8[sVar18] = '\0';
      uStack_2e0 = (code *)0x104f91;
      memcpy(v_fname,local_2d8,sVar18 + 1);
      if (*histo != 0) {
        pcVar25 = *argv;
        sVar17 = 0xffffffffffffffff;
        do {
          cVar2 = pcVar23[sVar17 + 1];
          local_2d8[sVar17 + 1] = cVar2;
          sVar17 = sVar17 + 1;
        } while (cVar2 != '\0');
        sVar5 = sVar17;
        do {
          sVar18 = sVar5;
          cVar2 = pcVar25[sVar18 - (long)(int)sVar17];
          local_2d8[sVar18] = cVar2;
          sVar5 = sVar18 + 1;
        } while (cVar2 != '\0');
        local_2d8[sVar18] = '\0';
        uStack_2e0 = (code *)0x104fe0;
        memcpy(h_fname,local_2d8,sVar18 + 1);
        sVar17 = 0xffffffffffffffff;
        do {
          cVar2 = h_fname[sVar17 + 1];
          local_2d8[sVar17 + 1] = cVar2;
          sVar17 = sVar17 + 1;
        } while (cVar2 != '\0');
        sVar5 = sVar17;
        do {
          sVar18 = sVar5;
          cVar2 = "."[sVar18 - (long)(int)sVar17];
          local_2d8[sVar18] = cVar2;
          sVar5 = sVar18 + 1;
        } while (cVar2 != '\0');
        local_2d8[sVar18] = '\0';
        uStack_2e0 = (code *)0x10501e;
        memcpy(h_fname,local_2d8,sVar18 + 1);
        pcVar25 = argv[3];
        sVar17 = 0xffffffffffffffff;
        do {
          cVar2 = h_fname[sVar17 + 1];
          local_2d8[sVar17 + 1] = cVar2;
          sVar17 = sVar17 + 1;
        } while (cVar2 != '\0');
        sVar5 = sVar17;
        do {
          sVar18 = sVar5;
          cVar2 = pcVar25[sVar18 - (long)(int)sVar17];
          local_2d8[sVar18] = cVar2;
          sVar5 = sVar18 + 1;
        } while (cVar2 != '\0');
        local_2d8[sVar18] = '\0';
        uStack_2e0 = (code *)0x10505c;
        memcpy(h_fname,local_2d8,sVar18 + 1);
        sVar17 = 0xffffffffffffffff;
        do {
          cVar2 = h_fname[sVar17 + 1];
          local_2d8[sVar17 + 1] = cVar2;
          sVar17 = sVar17 + 1;
        } while (cVar2 != '\0');
        sVar5 = sVar17;
        do {
          sVar18 = sVar5;
          cVar2 = "H"[sVar18 - (long)(int)sVar17];
          local_2d8[sVar18] = cVar2;
          sVar5 = sVar18 + 1;
        } while (cVar2 != '\0');
        local_2d8[sVar18] = '\0';
        uStack_2e0 = (code *)0x1050a4;
        memcpy(h_fname,local_2d8,sVar18 + 1);
        sVar17 = 0xffffffffffffffff;
        do {
          cVar2 = h_fname[sVar17 + 1];
          local_2d8[sVar17 + 1] = cVar2;
          sVar17 = sVar17 + 1;
        } while (cVar2 != '\0');
        sVar5 = sVar17;
        do {
          sVar18 = sVar5;
          cVar2 = local_288[sVar18 - (long)(int)sVar17];
          local_2d8[sVar18] = cVar2;
          sVar5 = sVar18 + 1;
        } while (cVar2 != '\0');
        local_2d8[sVar18] = '\0';
        uStack_2e0 = (code *)0x1050e5;
        memcpy(h_fname,local_2d8,sVar18 + 1);
      }
      uStack_2e0 = (code *)0x1050f6;
      printf(" Generated velocity filename  : %s\n",v_fname);
      uStack_2e0 = (code *)0x105107;
      printf(" Generated histogram filename : %s\n",h_fname);
      uStack_2e0 = (code *)0x105118;
      printf(" Input stem name              : %s\n",i_fname);
      uStack_2e0 = (code *)0x10512e;
      printf(" Correct velocity filename    : %s\n",c_fname);
      uStack_2e0 = (code *)0x10513d;
      fflush(_stdout);
      return;
    }
  }
  else {
    uStack_2e0 = (code *)0x105172;
    valid_option_cold_1();
    uVar6 = (uint)out_path;
    pcVar23 = (char *)argv;
    pfVar26 = sigma1;
  }
  argv = unaff_R14;
  uStack_2e0 = (code *)0x105177;
  valid_option_cold_13();
LAB_00105177:
  uStack_2e0 = (code *)0x10517c;
  valid_option_cold_7();
LAB_0010517c:
  uStack_2e0 = (code *)0x105181;
  valid_option_cold_5();
LAB_00105181:
  uStack_2e0 = (code *)0x105186;
  valid_option_cold_2();
LAB_00105186:
  uStack_2e0 = (code *)0x10518b;
  valid_option_cold_3();
LAB_0010518b:
  uStack_2e0 = (code *)0x105190;
  valid_option_cold_6();
LAB_00105190:
  uStack_2e0 = prod_histo;
  valid_option_cold_4();
  uVar19 = (ulong)uVar6;
  pfStack_ca8 = pfStack_2d0;
  pcStack_cf8 = (code *)0x1051d5;
  dStack_cf0 = extraout_XMM0_Qa;
  ptStack_c78 = extraout_RDX;
  uStack_308 = (ulong)(uint)argc;
  pfStack_300 = unaff_R12;
  pfStack_2f8 = unaff_R13;
  ppcStack_2f0 = argv;
  ppcStack_2e8 = (char **)unaff_R15;
  uStack_2e0 = (code *)unaff_RBP;
  ptVar10 = (qnode_ptr_t)malloc(0x170);
  uStack_cc0 = *(undefined8 *)pcVar25;
  uStack_cb8 = *(undefined8 *)((long)pcVar25 + 8);
  ptVar10->res = (int)uStack_cc0;
  ptVar10->sizx = (int)((ulong)uStack_cc0 >> 0x20);
  ptVar10->sizy = (int)uStack_cb8;
  ptVar10->sizz = (int)((ulong)uStack_cb8 >> 0x20);
  ptVar10->ofst = 0;
  ptVar10->level = 0;
  pcStack_cf8 = (code *)0x1051f7;
  padStack_cd0 = (disp_field512_t *)malloc(0xc3080);
  ptVar10->flow_ptr = padStack_cd0;
  pcStack_cf8 = (code *)0x10520e;
  load_velocity(ptVar10,pcVar23);
  dStack_ce8 = (double)CONCAT44(dStack_ce8._4_4_,(float)(int)uVar6);
  uVar22 = 0;
  pcStack_cf8 = (code *)0x105231;
  memset(afStack_7c0,0,0x4b0);
  pcStack_cf8 = (code *)0x105245;
  memset(afStack_c70,0,0x4b0);
  fStack_c7c = (float)dStack_cf0;
  fVar33 = dStack_ce8._0_4_ * fStack_c7c;
  *pfVar26 = 0.0;
  *sigma2 = 0.0;
  iVar9 = *(int *)((long)pcVar25 + 8);
  dStack_cf0 = (double)CONCAT44(dStack_cf0._4_4_,fVar33);
  iVar7 = KERNEL_Y;
  uStack_ce0 = uVar19;
  pfStack_ca0 = pfVar26;
  pfStack_c90 = sigma2;
  if (KERNEL_Y + 9 < (iVar9 - KERNEL_Y) + -9) {
    lStack_c98 = CONCAT44(lStack_c98._4_4_,uVar6 - 1);
    ptVar10 = (qnode_ptr_t)((long)KERNEL_Y + 9);
    iStack_cc4 = (int)(float)uStack_cc0;
    uStack_cd8 = (long)(int)(float)uStack_cc0;
    iVar24 = *(int *)((long)pcVar25 + 4);
    fVar34 = 0.0;
    iVar30 = 0;
    iVar21 = KERNEL_X;
    do {
      if (iVar21 + 9 < (iVar24 - iVar21) + -9) {
        uStack_c88 = (long)ptVar10 * uStack_cd8;
        uVar19 = (long)iVar21 + 9;
        do {
          lVar31 = uVar19 + (long)*(int *)pcVar25 * (long)ptVar10;
          lVar11 = *(long *)((long)pcVar25 + 0x158);
          fVar32 = *(float *)(lVar11 + lVar31 * 8);
          if (((fVar32 != -100.0) || (NAN(fVar32))) &&
             ((fVar32 = *(float *)(lVar11 + 4 + lVar31 * 8), fVar32 != 100.0 || (NAN(fVar32))))) {
            uVar6 = (uint)((*(float *)(*(long *)((long)pcVar25 +
                                                ((long)(*(int *)((long)pcVar25 + 0xc) / 2) * 2 +
                                                0x2e) * 4) + 0x18 + lVar31 * 0x20) / fVar33) *
                          dStack_ce8._0_4_);
            uStack_cc0 = CONCAT44(uStack_cc0._4_4_,fVar34);
            pcStack_cf8 = (code *)0x10538e;
            fVar33 = psi_error(*(disp_vect_t *)(lVar11 + lVar31 * 8),
                               padStack_cd0[-1][uStack_c88 + uVar19 + 0x18610]);
            fVar34 = (float)uStack_cc0 + fVar33;
            iVar30 = iVar30 + 1;
            if ((int)uStack_ce0 <= (int)uVar6) {
              uVar6 = (uint)lStack_c98;
            }
            lVar11 = (long)(int)uVar6;
            afStack_7c0[lVar11 * 3 + 1] = afStack_7c0[lVar11 * 3 + 1] + fVar33;
            aiStack_7b8[lVar11 * 3] = aiStack_7b8[lVar11 * 3] + 1;
            if (-1 < (int)uVar6) {
              lVar11 = 0;
              do {
                *(float *)((long)afStack_c70 + lVar11 + 4) =
                     *(float *)((long)afStack_c70 + lVar11 + 4) + fVar33;
                *(int *)((long)aiStack_c68 + lVar11) = *(int *)((long)aiStack_c68 + lVar11) + 1;
                lVar11 = lVar11 + 0xc;
              } while ((ulong)uVar6 * 0xc + 0xc != lVar11);
            }
            fVar33 = dStack_cf0._0_4_;
          }
          uVar22 = (ulong)((int)uVar22 + 1);
          uVar19 = uVar19 + 1;
          iVar24 = *(int *)((long)pcVar25 + 4);
        } while ((long)uVar19 < (long)((iVar24 - KERNEL_X) + -9));
        iVar9 = *(int *)((long)pcVar25 + 8);
        iVar7 = KERNEL_Y;
        iVar21 = KERNEL_X;
      }
      ptVar10 = (qnode_ptr_t)((long)&ptVar10->res + 1);
    } while ((long)ptVar10 < (long)((iVar9 - iVar7) + -9));
    uStack_cd8 = CONCAT44(uStack_cd8._4_4_,(float)iVar30);
    iVar24 = iStack_cc4;
    if ((int)uVar22 == 0) {
      fVar32 = 0.0;
    }
    else {
      fVar32 = (float)iVar30 / (float)(int)uVar22;
    }
  }
  else {
    fVar32 = 0.0;
    uStack_cd8 = (ulong)uStack_cd8._4_4_ << 0x20;
    fVar34 = 0.0;
    iVar24 = (int)(float)uStack_cc0;
  }
  uVar28 = uStack_ce0 & 0xffffffff;
  *pfStack_ca8 = fVar32;
  *pfStack_ca0 = fVar34 / (float)uStack_cd8;
  if (0 < (int)uStack_ce0) {
    lVar11 = 0;
    do {
      if (*(int *)((long)aiStack_7b8 + lVar11) != 0) {
        *(float *)((long)afStack_7c0 + lVar11 + 4) =
             *(float *)((long)afStack_7c0 + lVar11 + 4) /
             (float)*(int *)((long)aiStack_7b8 + lVar11);
      }
      if (*(int *)((long)aiStack_c68 + lVar11) != 0) {
        *(float *)((long)afStack_c70 + lVar11 + 4) =
             *(float *)((long)afStack_c70 + lVar11 + 4) /
             (float)*(int *)((long)aiStack_c68 + lVar11);
      }
      lVar11 = lVar11 + 0xc;
    } while (uVar28 * 0xc != lVar11);
  }
  if (iVar7 + 9 < (iVar9 - iVar7) + -9) {
    uVar6 = (int)uStack_ce0 - 1;
    uVar19 = (ulong)uVar6;
    ptVar10 = (qnode_ptr_t)(long)(iVar7 + 9);
    lStack_c98 = (long)iVar24;
    iVar24 = *(int *)((long)pcVar25 + 4);
    uStack_cc0 = CONCAT44(uStack_cc0._4_4_,fVar34 / (float)uStack_cd8);
    iVar21 = KERNEL_X;
    uStack_c88 = uVar28;
    do {
      if (iVar21 + 9 < (iVar24 - iVar21) + -9) {
        lVar11 = (long)ptVar10 * lStack_c98;
        lVar31 = (long)iVar21 + 9;
        do {
          lVar12 = (long)*(int *)pcVar25 * (long)ptVar10 + lVar31;
          lVar13 = *(long *)((long)pcVar25 + 0x158);
          fVar32 = *(float *)(lVar13 + lVar12 * 8);
          if (((fVar32 != -100.0) || (NAN(fVar32))) &&
             ((fVar32 = *(float *)(lVar13 + 4 + lVar12 * 8), fVar32 != 100.0 || (NAN(fVar32))))) {
            uVar20 = (uint)((*(float *)(*(long *)((long)pcVar25 +
                                                 ((long)(*(int *)((long)pcVar25 + 0xc) / 2) * 2 +
                                                 0x2e) * 4) + 0x18 + lVar12 * 0x20) / fVar33) *
                           dStack_ce8._0_4_);
            pcStack_cf8 = (code *)0x105608;
            fVar32 = psi_error(*(disp_vect_t *)(lVar13 + lVar12 * 8),
                               (*padStack_cd0)[lVar31 + lVar11]);
            *pfStack_c90 = *pfStack_c90 +
                           ((float)uStack_cc0 - fVar32) * ((float)uStack_cc0 - fVar32);
            if ((int)uStack_ce0 <= (int)uVar20) {
              uVar20 = uVar6;
            }
            uVar22 = (ulong)uVar20;
            lVar13 = (long)(int)uVar20;
            afStack_7c0[lVar13 * 3] =
                 afStack_7c0[lVar13 * 3] +
                 (afStack_7c0[lVar13 * 3 + 1] - fVar32) * (afStack_7c0[lVar13 * 3 + 1] - fVar32);
            fVar33 = dStack_cf0._0_4_;
            if (-1 < (int)uVar20) {
              lVar13 = 0;
              do {
                fVar34 = *(float *)((long)afStack_c70 + lVar13 + 4) - fVar32;
                *(float *)((long)afStack_c70 + lVar13) =
                     *(float *)((long)afStack_c70 + lVar13) + fVar34 * fVar34;
                lVar13 = lVar13 + 0xc;
              } while (uVar22 * 0xc + 0xc != lVar13);
            }
          }
          lVar31 = lVar31 + 1;
          iVar24 = *(int *)((long)pcVar25 + 4);
        } while (lVar31 < (iVar24 - KERNEL_X) + -9);
        iVar9 = *(int *)((long)pcVar25 + 8);
        uVar28 = uStack_c88;
        iVar7 = KERNEL_Y;
        iVar21 = KERNEL_X;
      }
      ptVar10 = (qnode_ptr_t)((long)&ptVar10->res + 1);
    } while ((long)ptVar10 < (long)((iVar9 - iVar7) + -9));
  }
  fVar33 = *pfStack_c90 / (float)uStack_cd8;
  if (fVar33 < 0.0) {
    pcStack_cf8 = (code *)0x10573f;
    fVar33 = sqrtf(fVar33);
  }
  else {
    fVar33 = SQRT(fVar33);
  }
  uVar3 = uStack_ce0;
  *pfStack_c90 = fVar33;
  iVar9 = (int)uStack_ce0;
  if (0 < iVar9) {
    uVar19 = uVar28 * 0xc;
    ptVar10 = (qnode_ptr_t)0x0;
    do {
      if (*(int *)((long)aiStack_7b8 + (long)ptVar10) != 0) {
        fVar33 = *(float *)((long)afStack_7c0 + (long)ptVar10) /
                 (float)*(int *)((long)aiStack_7b8 + (long)ptVar10);
        if (fVar33 < 0.0) {
          pcStack_cf8 = (code *)0x105799;
          fVar33 = sqrtf(fVar33);
        }
        else {
          fVar33 = SQRT(fVar33);
        }
        *(float *)((long)afStack_7c0 + (long)ptVar10) = fVar33;
      }
      if (*(int *)((long)aiStack_c68 + (long)ptVar10) != 0) {
        fVar33 = *(float *)((long)afStack_c70 + (long)ptVar10) /
                 (float)*(int *)((long)aiStack_c68 + (long)ptVar10);
        if (fVar33 < 0.0) {
          pcStack_cf8 = (code *)0x1057d7;
          fVar33 = sqrtf(fVar33);
        }
        else {
          fVar33 = SQRT(fVar33);
        }
        *(float *)((long)afStack_c70 + (long)ptVar10) = fVar33;
      }
      ptVar10 = (qnode_ptr_t)((long)ptVar10 + 0xc);
    } while ((qnode_ptr_t)uVar19 != ptVar10);
  }
  pcVar23 = "w";
  pcStack_cf8 = (code *)0x105802;
  __stream = fopen((char *)ptStack_c78,"w");
  if (__stream != (FILE *)0x0) {
    uStack_cc0 = CONCAT44(uStack_cc0._4_4_,(float)aiStack_c68[0]);
    pcStack_cf8 = (code *)0x105836;
    fprintf(__stream,"%2d\n",2);
    pcStack_cf8 = (code *)0x10584a;
    fprintf(__stream,"%3d\n",uVar3 & 0xffffffff);
    padStack_cd0 = (disp_field512_t *)((double)fStack_c7c * -0.5 + (double)dStack_cf0._0_4_);
    pcStack_cf8 = (code *)0x10587e;
    fprintf(__stream,"%5.7f\n");
    if (iVar9 < 1) {
      pcStack_cf8 = (code *)0x1059dc;
      fwrite("\n\n\n",3,1,__stream);
      pcStack_cf8 = (code *)0x1059f0;
      fprintf(__stream,"%3d\n",uVar3 & 0xffffffff);
      pcStack_cf8 = (code *)0x105a07;
      fprintf(__stream,"%5.7f\n",padStack_cd0);
    }
    else {
      dStack_ce8._0_4_ = dStack_cf0._0_4_ / dStack_ce8._0_4_;
      dStack_cf0 = (double)CONCAT44(dStack_cf0._4_4_,dStack_ce8._0_4_);
      dStack_ce8 = (double)dStack_ce8._0_4_ * 0.5;
      piVar14 = aiStack_7b8;
      uVar19 = 0;
      do {
        pcStack_cf8 = (code *)0x105900;
        fprintf(__stream,"%5.7f %10.7f %10.7f %3.7f\n",
                (double)((float)(int)uVar19 * dStack_cf0._0_4_) + dStack_ce8,
                (double)(float)piVar14[-1],(double)(float)piVar14[-2],
                (double)((float)*piVar14 / (float)uStack_cc0));
        uVar19 = uVar19 + 1;
        piVar14 = piVar14 + 3;
      } while (uVar28 != uVar19);
      pcStack_cf8 = (code *)0x105925;
      fwrite("\n\n\n",3,1,__stream);
      pcStack_cf8 = (code *)0x105939;
      fprintf(__stream,"%3d\n",uVar28 & 0xffffffff);
      pcStack_cf8 = (code *)0x105950;
      fprintf(__stream,"%5.7f\n",padStack_cd0);
      if (0 < (int)uStack_ce0) {
        piVar14 = aiStack_c68;
        uVar19 = 0;
        do {
          pcStack_cf8 = (code *)0x1059b5;
          fprintf(__stream,"%5.7f %10.7f %10.7f %3.7f\n",
                  (double)((float)(int)uVar19 * dStack_cf0._0_4_) + dStack_ce8,
                  (double)(float)piVar14[-1],(double)(float)piVar14[-2],
                  (double)((float)*piVar14 / (float)uStack_cc0));
          uVar19 = uVar19 + 1;
          piVar14 = piVar14 + 3;
        } while (uVar28 != uVar19);
      }
    }
    fclose(__stream);
    return;
  }
  pcStack_cf8 = write_velocity;
  prod_histo_cold_1();
  uStack_d00 = uVar3;
  q = (qnode_ptr_t)0x180;
  uStack_d20 = uVar19;
  piStack_d18 = (int *)pcVar25;
  uStack_d10 = uVar28;
  ptStack_d08 = ptVar10;
  pcStack_cf8 = (code *)uVar22;
  iVar9 = creat((char *)ptStack_c78,0x180);
  if (0 < iVar9) {
    fStack_d28 = (float)*(int *)((long)pcVar23 + 4);
    fStack_d2c = (float)*(int *)((long)pcVar23 + 8);
    write(iVar9,&fStack_d28,4);
    write(iVar9,&fStack_d2c,4);
    fStack_d28 = (float)(*(int *)((long)pcVar23 + 4) + KERNEL_X * -2 + -0x12);
    fStack_d2c = (float)(*(int *)((long)pcVar23 + 8) + KERNEL_Y * -2 + -0x12);
    write(iVar9,&fStack_d28,4);
    write(iVar9,&fStack_d2c,4);
    fStack_d28 = (float)(KERNEL_X + 9);
    fStack_d2c = (float)(KERNEL_Y + 9);
    write(iVar9,&fStack_d28,4);
    write(iVar9,&fStack_d2c,4);
    iVar7 = KERNEL_Y + 9;
    iVar24 = *(int *)((long)pcVar23 + 8);
    if (iVar7 < (iVar24 - KERNEL_Y) + -9) {
      iVar21 = *(int *)((long)pcVar23 + 4);
      iVar30 = KERNEL_Y;
      iVar27 = KERNEL_X;
      do {
        if (iVar27 + 9 < (iVar21 - iVar27) + -9) {
          lVar11 = (long)iVar27 + 9;
          iStack_d24 = iVar7;
          do {
            lVar31 = (long)*(int *)pcVar23 * (long)iVar7 + lVar11;
            fStack_d28 = *(float *)(*(long *)((long)pcVar23 + 0x158) + 4 + lVar31 * 8);
            fStack_d2c = -*(float *)(*(long *)((long)pcVar23 + 0x158) + lVar31 * 8);
            write(iVar9,&fStack_d28,4);
            write(iVar9,&fStack_d2c,4);
            lVar11 = lVar11 + 1;
            iVar21 = *(int *)((long)pcVar23 + 4);
          } while ((int)lVar11 < (iVar21 - KERNEL_X) + -9);
          iVar24 = *(int *)((long)pcVar23 + 8);
          iVar30 = KERNEL_Y;
          iVar27 = KERNEL_X;
          iVar7 = iStack_d24;
        }
        iVar7 = iVar7 + 1;
      } while (iVar7 < (iVar24 - iVar30) + -9);
    }
    close(iVar9);
    return;
  }
  ptVar10 = ptStack_c78;
  write_velocity_cold_1();
  q_00 = (qnode_ptr_t)(ulong)(uint)q->sizy;
  iVar9 = q->ofst;
  iVar7 = q->sizy - iVar9;
  if (iVar9 < iVar7) {
    iVar24 = q->sizx;
    iVar21 = iVar9;
    do {
      if (iVar9 < iVar24 - iVar9) {
        uVar19 = (ulong)(uint)q->sizz;
        iVar7 = iVar9;
        do {
          if (0 < (int)uVar19) {
            lVar11 = 0;
            do {
              fVar33 = dx(ptVar10,q,iVar21,iVar7,(int)lVar11);
              (*q->param_ptr[lVar11])[q->res * iVar21 + iVar7].fx = fVar33;
              fVar33 = dy(ptVar10,q,iVar21,iVar7,(int)lVar11);
              (*q->param_ptr[lVar11])[q->res * iVar21 + iVar7].fy = fVar33;
              lVar11 = lVar11 + 1;
              uVar19 = (ulong)q->sizz;
            } while (lVar11 < (long)uVar19);
            iVar24 = q->sizx;
            iVar9 = q->ofst;
          }
          iVar7 = iVar7 + 1;
        } while (iVar7 < iVar24 - iVar9);
        q_00 = (qnode_ptr_t)(ulong)(uint)q->sizy;
      }
      iVar21 = iVar21 + 1;
      iVar7 = (int)q_00 - iVar9;
    } while (iVar21 < iVar7);
  }
  iVar24 = (int)q_00;
  iVar21 = ptVar10->sizz / 2;
  if (iVar9 < iVar7) {
    iVar30 = q->sizx;
    iStack_d94 = iVar9;
    do {
      if (iVar9 < iVar30 - iVar9) {
        piVar14 = &(*q->param_ptr[iVar21])[(long)iStack_d94 * (long)q->res + (long)iVar9].err;
        iVar29 = iVar30 + iVar9 * -2;
        iVar27 = iVar9;
        do {
          if (*piVar14 == 0) {
            fVar33 = dt(ptVar10,q_00,iStack_d94,iVar27);
            piVar14[-4] = (int)fVar33;
          }
          iVar27 = iVar27 + 1;
          piVar14 = piVar14 + 8;
          iVar29 = iVar29 + -1;
        } while (iVar29 != 0);
      }
      iStack_d94 = iStack_d94 + 1;
    } while (iStack_d94 != iVar7);
  }
  iVar7 = iVar24 - iVar9;
  if ((extraout_EDX == 0) && (iVar9 < iVar7)) {
    iVar30 = q->sizx;
    iVar27 = iVar9;
    do {
      if (iVar9 < iVar30 - iVar9) {
        papVar15 = q->param_ptr[iVar21];
        iVar7 = q->res;
        lVar11 = (long)iVar9;
        do {
          if ((*papVar15)[iVar27 * iVar7 + lVar11].err == 0) {
            iVar9 = (int)lVar11;
            fVar33 = dxx(q,iVar27,iVar9,iVar21);
            (*q->param_ptr[iVar21])[(long)q->res * (long)iVar27 + lVar11].fxx = fVar33;
            fVar33 = dyy(q,iVar27,iVar9,iVar21);
            (*q->param_ptr[iVar21])[(long)q->res * (long)iVar27 + lVar11].fyy = fVar33;
            fVar33 = dxy(q,iVar27,iVar9,iVar21);
            papVar15 = q->param_ptr[iVar21];
            iVar7 = q->res;
            (*papVar15)[iVar27 * iVar7 + lVar11].fxy = fVar33;
            iVar30 = q->sizx;
            iVar9 = q->ofst;
          }
          lVar11 = lVar11 + 1;
        } while ((int)lVar11 < iVar30 - iVar9);
        iVar24 = q->sizy;
      }
      iVar27 = iVar27 + 1;
      iVar7 = iVar24 - iVar9;
    } while (iVar27 < iVar7);
  }
  if (iVar9 < iVar7) {
    lVar31 = (long)iVar9;
    lVar11 = q->sizx - lVar31;
    iVar24 = iVar9;
    do {
      if (iVar9 < (int)lVar11) {
        piVar14 = &(*q->param_ptr[iVar21])[(long)iVar24 * (long)q->res + lVar31].err;
        lVar13 = lVar31;
        do {
          if (*piVar14 == 0) {
            fVar33 = (float)*(undefined8 *)(piVar14 + -3);
            fVar32 = (float)((ulong)*(undefined8 *)(piVar14 + -3) >> 0x20);
            piVar14[-1] = (int)SQRT(fVar32 * fVar32 + fVar33 * fVar33);
          }
          lVar13 = lVar13 + 1;
          piVar14 = piVar14 + 8;
        } while (lVar13 < lVar11);
      }
      iVar24 = iVar24 + 1;
    } while (iVar24 != iVar7);
  }
  return;
}

Assistant:

void valid_option(argc,argv,in_path,out_path,sigma1,sigma2,histo,sf,trsh,
             i_fname,v_fname,c_fname,h_fname,nbin,incr,n_frame,alpha,
             delta,iter,binary,row,col,horn,vmag,maxv)
int argc ;
char *argv[] ;
int *nbin, *iter, *n_frame, *histo, *sf, *binary, *row, *col, *horn, *vmag ;
float *incr, *sigma1, *sigma2, *trsh, *alpha, *delta, *maxv ;
string in_path, out_path, i_fname, v_fname, c_fname, h_fname ;

{ int i ;
  string ext, t0, str_sg, str_tg, str_trsh, str_alpha, str_delta ;

  if (argc == 1) {
    usage() ;
  }
  if ((argc <= 28) && (argc >= 4)) {
    *binary = FALSE ;
    *horn = FALSE ;
    *vmag = FALSE ;
    *sf = FALSE ;
    *histo = FALSE ;
    *trsh = 0.0 ;
    *maxv = 0.0 ;
    *sigma1 = DEF_S1 ;
    strcpy(str_sg,"3.0") ;
    *sigma2 = DEF_S2 ;
    strcpy(str_tg,"1.5") ;
    *iter = RELAXITER ;
    *alpha = ALPHA ;
    strcpy(str_alpha,"5.0") ;
    *delta = DELTA ;
    strcpy(str_delta,"1.0") ;
    *n_frame = 0 ;
    *nbin = 0 ;
    strcpy(i_fname,"Undefined") ;
    strcpy(v_fname,"Undefined") ;
    strcpy(c_fname,"Undefined") ;
    strcpy(h_fname,"Undefined") ;
  }
  else {
    error(1) ;
  }
  i = 4 ;
  while (i < argc) {
    if (strcmp("-A",argv[i]) == 0) {
      if (i + 1 < argc) {
        sscanf(argv[i+1],"%f",alpha) ;
        strcpy(str_alpha,argv[i+1]) ;
        i += 2 ;
      }
      else {
        error(1) ;
      }
    }
    else {
      if (strcmp("-F",argv[i]) == 0) {
        if (i + 1 < argc) {
          sscanf(argv[i+1],"%f",trsh) ;
          strcpy(str_trsh,argv[i+1]) ;
          *sf = TRUE ;
          i += 2 ;
        }
        else {
          error(1) ;
        }
      }
      else {
        if (strcmp("-C",argv[i]) == 0) {
          if (i + 3 < argc) {
            strcpy(c_fname,argv[i+1]) ;
            sscanf(argv[i+2],"%d",nbin) ;
            sscanf(argv[i+3],"%f",incr) ;
            *histo = TRUE ;
            i += 4 ;
          }
          else {
            error(1) ;
          }
        }
        else {
          if (strcmp("-I",argv[i]) == 0) {
            if (i + 1 < argc) {
              sscanf(argv[i+1],"%d",iter) ;
              i += 2 ;
            }
            else {
              error(1) ;
            }
          }
          else {
            if (strcmp("-SG", argv[i]) == 0) {
              if (i + 1 < argc) {
                sscanf(argv[i+1],"%f",sigma1) ;
                strcpy(str_sg,argv[i+1]) ;
                i += 2 ;
              }
              else {
                error(1) ;
              }
            }
            else {
              if (strcmp("-TG",argv[i]) == 0) {
                if (i + 1 < argc) {
                  sscanf(argv[i+1],"%f",sigma2) ;
                  strcpy(str_tg,argv[i+1]) ;
                  i += 2 ;
                }
                else {
                  error(1) ;
                }
              }
              else {
                if (strcmp("-M",argv[i]) == 0) {
                  if (i + 1 < argc) {
                    sscanf(argv[i+1],"%d",n_frame) ;
                    i += 2 ;
                  }
                  else {
                    error(1) ;
                  }
                }
                else {
                  if (strcmp("-B",argv[i]) == 0) {
                    if (i + 2 < argc) {
                      sscanf(argv[i+1],"%d",col) ;
                      sscanf(argv[i+2],"%d",row) ;
                      *binary = TRUE ;
                      i += 3 ;
                    }
                    else {
                      error(1) ;
                    }
                  }
                  else {
                    if (strcmp("-H",argv[i]) == 0) {
                      *horn = TRUE ;
                      i++ ;
                    }
                    else {
                      if (strcmp("-D",argv[i]) == 0) {
                        if (i + 1 < argc) {
                          sscanf(argv[i+1],"%f",delta) ;
                          strcpy(str_delta,argv[i+1]) ;
                          i += 2 ;
                        }
                        else {
                          error(1) ;
                        }
                      }
                      else {
                        if (strcmp("-V",argv[i]) == 0) {
                          if (i + 1 < argc) {
                            *vmag = TRUE ;
                            sscanf(argv[i+1],"%f",maxv) ;
                            i += 2 ;
                          }
                          else {
                            error(1) ;
                          }
                        }
                        else {
                          error(2) ;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  if (*nbin > N_BINS) {
    error(15) ;
  }
  concat(argv[1],"/",in_path) ;
  concat(argv[2],"/",out_path) ;
  concat(in_path,argv[3],i_fname) ;
  strcpy(ext,"-sg") ;
  concat(ext,str_sg,ext) ;
  concat(ext,"-tg",ext) ;
  concat(ext,str_tg,ext) ;
  concat(ext,"-m",ext) ;
  sprintf(t0,"%d",*n_frame);
  concat(ext,t0,ext) ;
  concat(ext,"-i",ext) ;
  sprintf(t0,"%d",*iter);
  concat(ext,t0,ext) ;
  concat(ext,"-a",ext) ;
  concat(ext,str_alpha,ext) ;
  if (!(*horn)) {
    concat(ext,"-d",ext) ;
    concat(ext,str_delta,ext) ;
  }
  if (*horn) {
    concat(ext,"-h",ext) ;
  }
  if (*sf) {
    concat(ext,"-f",ext) ;
    concat(ext,str_trsh,ext) ;
  }
  concat(out_path,argv[0],v_fname) ;
  concat(v_fname,".",v_fname) ;
  concat(v_fname,argv[3],v_fname) ;
  concat(v_fname,"F",v_fname) ;
  concat(v_fname,ext,v_fname) ;
  if (*histo) {
    concat(out_path,argv[0],h_fname) ;
    concat(h_fname,".",h_fname) ;
    concat(h_fname,argv[3],h_fname) ;
    concat(h_fname,"H",h_fname) ;
    concat(h_fname,ext,h_fname) ;
  }
  printf(" Generated velocity filename  : %s\n",v_fname) ;
  printf(" Generated histogram filename : %s\n",h_fname) ;
  printf(" Input stem name              : %s\n",i_fname) ;
  printf(" Correct velocity filename    : %s\n",c_fname) ;
  fflush(stdout) ;
}